

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  _Bit_iterator __last;
  _Bit_iterator __first;
  bool bVar2;
  difference_type dVar3;
  Graph *this;
  vector<bool,_std::allocator<bool>_> *pvVar4;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  ostream *poVar6;
  long in_RSI;
  int in_EDI;
  iterator iVar7;
  reference rVar8;
  bool in_stack_00000016;
  bool in_stack_00000017;
  Graph *in_stack_00000018;
  int i;
  vector<bool,_std::allocator<bool>_> vertexCover;
  Graph graph;
  string arg;
  int index;
  bool anyLpSolution;
  bool useLinearProgramming;
  char *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  _Bit_type *in_stack_fffffffffffffec8;
  bool *in_stack_fffffffffffffed0;
  _Bit_type *in_stack_fffffffffffffed8;
  istream *in_stack_fffffffffffffee8;
  vector<bool,_std::allocator<bool>_> *this_00;
  _Bit_reference local_f0;
  int local_e0;
  undefined1 local_d9;
  _Bit_type *local_d8;
  uint local_d0;
  _Bit_type *local_c8;
  uint local_c0;
  _Bit_type *local_b8;
  uint local_b0;
  _Bit_type *local_a8;
  uint local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  vector<bool,_std::allocator<bool>_> local_70;
  allocator local_39;
  string local_38 [32];
  int local_18;
  undefined1 local_12;
  undefined1 local_11;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::ios_base::sync_with_stdio(false);
  local_11 = 0;
  local_12 = 0;
  for (local_18 = 1; local_18 < local_8; local_18 = local_18 + 1) {
    pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8);
    if (bVar2) {
      local_11 = 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                              in_stack_fffffffffffffea8);
      if (bVar2) {
        local_12 = 1;
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  this_00 = &local_70;
  readGraph(in_stack_fffffffffffffee8);
  Graph::findVertexCover(in_stack_00000018,in_stack_00000017,in_stack_00000016);
  pvVar4 = &local_98;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x102668);
  local_b8 = iVar7.super__Bit_iterator_base._M_p;
  local_b0 = iVar7.super__Bit_iterator_base._M_offset;
  local_a8 = local_b8;
  local_a0 = local_b0;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::end(pvVar4);
  local_d8 = iVar7.super__Bit_iterator_base._M_p;
  local_d0 = iVar7.super__Bit_iterator_base._M_offset;
  local_d9 = 1;
  __first.super__Bit_iterator_base._8_8_ = this_00;
  __first.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffffee8;
  __last.super__Bit_iterator_base._8_8_ = pvVar4;
  __last.super__Bit_iterator_base._M_p = in_stack_fffffffffffffed8;
  local_c8 = local_d8;
  local_c0 = local_d0;
  dVar3 = std::count<std::_Bit_iterator,bool>(__first,__last,in_stack_fffffffffffffed0);
  this = (Graph *)std::ostream::operator<<((ostream *)&std::cout,dVar3);
  std::operator<<((ostream *)this,'\n');
  local_e0 = 0;
  while( true ) {
    pvVar4 = (vector<bool,_std::allocator<bool>_> *)(long)local_e0;
    pvVar5 = (vector<bool,_std::allocator<bool>_> *)
             std::vector<bool,_std::allocator<bool>_>::size(this_00);
    if (pvVar5 <= pvVar4) break;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (pvVar4,(size_type)in_stack_fffffffffffffec8);
    local_f0._M_mask = rVar8._M_mask;
    in_stack_fffffffffffffec8 = rVar8._M_p;
    local_f0._M_p = in_stack_fffffffffffffec8;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_f0);
    if (bVar2) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_e0);
      std::operator<<(poVar6,' ');
    }
    local_e0 = local_e0 + 1;
  }
  bVar2 = Graph::isVertexCover(this,pvVar4);
  if (bVar2) {
    local_4 = 0;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x102874);
    Graph::~Graph((Graph *)0x102881);
    return local_4;
  }
  __assert_fail("graph.isVertexCover(vertexCover)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/crismaz[P]vertex-cover/main.cpp"
                ,0x30,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {
    std::ios_base::sync_with_stdio(false);

    bool useLinearProgramming = false, anyLpSolution = false;
    for (int index = 1; index < argc; index++) {
        std::string arg(argv[index]);
        if (arg == "-useLp") {
            useLinearProgramming = true;
        } else if (arg == "-anyLpSolution") {
            anyLpSolution = true;
        }
    }

    Graph graph = readGraph();
    auto vertexCover = graph.findVertexCover(useLinearProgramming, anyLpSolution);

    std::cout << std::count(vertexCover.begin(), vertexCover.end(), true) << '\n';
    for (int i = 0; i < vertexCover.size(); i++) {
        if (vertexCover[i]) {
            std::cout << i << ' ';
        }
    }

    assert(graph.isVertexCover(vertexCover)); // check that a valid vertex cover was found

    return 0;
}